

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyt(fitsfile *fptr,char *keyname,long *ivalue,double *fraction,char *comm,int *status)

{
  char *pcVar1;
  fitsfile *in_RCX;
  long *in_RDX;
  char *in_R8;
  int *in_R9;
  char *loc;
  char valstring [71];
  char local_88 [64];
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (*in_R9 < 1) {
    ffgkey(in_RCX,in_R8,(char *)in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ffc2d((char *)valstring._40_8_,(double *)valstring._32_8_,(int *)valstring._24_8_);
    *in_RDX = (long)*(double *)in_RCX;
    *(double *)in_RCX = *(double *)in_RCX - (double)*in_RDX;
    pcVar1 = strchr(local_88,0x2e);
    if (((pcVar1 != (char *)0x0) && (pcVar1 = strchr(local_88,0x45), pcVar1 == (char *)0x0)) &&
       (pcVar1 = strchr(local_88,0x44), pcVar1 == (char *)0x0)) {
      ffc2d((char *)valstring._40_8_,(double *)valstring._32_8_,(int *)valstring._24_8_);
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgkyt( fitsfile *fptr,      /* I - FITS file pointer                 */
            const char   *keyname,     /* I - name of keyword to read           */
            long   *ivalue,      /* O - integer part of keyword value     */
            double *fraction,    /* O - fractional part of keyword value  */
            char   *comm,        /* O - keyword comment                   */
            int    *status)      /* IO - error status                     */
/*
  Read (get) the named keyword, returning the value and comment.
  The integer and fractional parts of the value are returned in separate
  variables, to allow more numerical precision to be passed.  This
  effectively passes a 'triple' precision value, with a 4-byte integer
  and an 8-byte fraction.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];
    char *loc;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    /*  read the entire value string as a double, to get the integer part */
    ffc2d(valstring, fraction, status);

    *ivalue = (long) *fraction;

    *fraction = *fraction - *ivalue;

    /* see if we need to read the fractional part again with more precision */
    /* look for decimal point, without an exponential E or D character */

    loc = strchr(valstring, '.');
    if (loc)
    {
        if (!strchr(valstring, 'E') && !strchr(valstring, 'D'))
            ffc2d(loc, fraction, status);
    }

    return(*status);
}